

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_gets(void *src_ptr,int *src_stride_ar,void *dst_ptr,int *dst_stride_ar,int *count,
              int stride_levels,int proc,comex_group_t group)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t __n;
  long lVar8;
  long lVar9;
  char *__assertion;
  int size;
  int world_proc;
  int local_d0;
  int local_b8 [2];
  undefined1 local_b0 [28];
  int local_94;
  undefined1 local_90 [24];
  int local_78 [9];
  int local_54 [9];
  
  iVar2 = comex_group_size(group,local_b8);
  if (iVar2 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < local_b8[0]) {
        if (group == 0) {
          local_d0 = proc;
        }
        else {
          comex_group_translate_world(group,proc,local_78);
          local_d0 = local_78[0];
        }
        iVar2 = 1;
        if (0 < stride_levels) {
          uVar6 = 1;
          do {
            iVar2 = iVar2 * count[uVar6];
            uVar6 = uVar6 + 1;
          } while (stride_levels + 1 != uVar6);
        }
        local_b8[1] = 0;
        local_78[1] = 1;
        local_94 = 0;
        local_54[0] = 1;
        if (1 < stride_levels) {
          __n = (ulong)(stride_levels - 1) << 2;
          lVar7 = 0;
          memset(local_b0,0,__n);
          memset(local_90,0,__n);
          iVar3 = 1;
          iVar5 = 1;
          do {
            iVar1 = count[lVar7 + 1];
            iVar5 = iVar5 * iVar1;
            local_78[lVar7 + 2] = iVar5;
            iVar3 = iVar3 * iVar1;
            local_54[lVar7 + 1] = iVar3;
            lVar7 = lVar7 + 1;
          } while ((ulong)(uint)stride_levels - 1 != lVar7);
        }
        if (0 < iVar2) {
          lVar7 = (ulong)(stride_levels + 1) - 1;
          iVar3 = 0;
          do {
            if (stride_levels < 1) {
              lVar9 = 0;
LAB_0015eea4:
              lVar8 = 0;
            }
            else {
              lVar8 = 0;
              lVar9 = 0;
              do {
                lVar9 = lVar9 + (long)src_stride_ar[lVar8] *
                                (long)*(int *)(local_b0 + lVar8 * 4 + -4);
                iVar5 = *(int *)(local_b0 + lVar8 * 4 + -4) +
                        (uint)((iVar3 + 1) % local_78[lVar8 + 1] == 0);
                if (count[lVar8 + 1] <= iVar5) {
                  iVar5 = 0;
                }
                *(int *)(local_b0 + lVar8 * 4 + -4) = iVar5;
                lVar8 = lVar8 + 1;
              } while (lVar7 != lVar8);
              if (stride_levels < 1) goto LAB_0015eea4;
              lVar4 = 0;
              lVar8 = 0;
              do {
                lVar8 = lVar8 + (long)dst_stride_ar[lVar4] *
                                (long)*(int *)(local_90 + lVar4 * 4 + -4);
                iVar5 = *(int *)(local_90 + lVar4 * 4 + -4) +
                        (uint)((iVar3 + 1) % local_54[lVar4] == 0);
                if (count[lVar4 + 1] <= iVar5) {
                  iVar5 = 0;
                }
                *(int *)(local_90 + lVar4 * 4 + -4) = iVar5;
                lVar4 = lVar4 + 1;
              } while (lVar7 != lVar4);
            }
            iVar3 = iVar3 + 1;
            _get_nbi((void *)(lVar9 + (long)src_ptr),(void *)(lVar8 + (long)dst_ptr),*count,local_d0
                    );
          } while (iVar3 != iVar2);
        }
        comex_make_progress();
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x359,
                "int comex_gets(void *, int *, void *, int *, int *, int, int, comex_group_t)");
}

Assistant:

int comex_gets(
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_gets(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        dst_idx = 0;
        
        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _get_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc);
    }
    
    comex_wait_proc(proc, group);
    
    return COMEX_SUCCESS;
}